

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O1

Var Js::ArrayBuffer::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  uint32 length;
  int iVar6;
  undefined4 *puVar7;
  Var instance;
  Var value;
  ArrayBuffer *obj;
  ArrayBuffer *pAVar8;
  RecyclableObject *constructor;
  int in_stack_00000010;
  Arguments local_60;
  Var local_50;
  CallInfo local_48;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_48 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != local_48._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x181,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b2eb13;
    *puVar7 = 0;
  }
  callInfo_local = local_48;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_48);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)callInfo_local & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x184,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00b2eb13;
    *puVar7 = 0;
  }
  instance = CallInfo::GetNewTarget
                       ((uint)callInfo_local._0_4_ >> 0x18,(Var *)&stack0x00000018,
                        callInfo_local._0_4_ & 0xffffff);
  local_60.Info = callInfo_local;
  local_60.Values = (Type)&stack0x00000018;
  bVar3 = JavascriptOperators::GetAndAssertIsConstructorSuperCall(&local_60);
  if (((ulong)callInfo_local & 0x1000000) != 0) {
    if (instance != (Var)0x0) {
      BVar5 = JavascriptOperators::IsUndefinedObject(instance);
      if (BVar5 != 0) goto LAB_00b2eaff;
    }
    if (((ulong)callInfo_local & 0xfffffe) == 0) {
      length = 0;
    }
    else {
      value = Arguments::operator[]((Arguments *)&callInfo_local,1);
      length = ToIndex(value,-0x7ff5ec5b,pSVar1,0x7fffffff,true);
    }
    obj = JavascriptLibrary::CreateArrayBuffer
                    ((pSVar1->super_ScriptContextBase).javascriptLibrary,length);
    bVar4 = VarIs<Js::ArrayBuffer,Js::RecyclableObject>((RecyclableObject *)obj);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      local_50 = instance;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                  ,0x195,"(VarIs<ArrayBuffer>(newArr))","VarIs<ArrayBuffer>(newArr)"
                                 );
      if (!bVar4) {
LAB_00b2eb13:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
      instance = local_50;
    }
    if (length != 0) {
      pAVar8 = VarTo<Js::ArrayBuffer,Js::RecyclableObject>((RecyclableObject *)obj);
      iVar6 = (*(pAVar8->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x71])(pAVar8);
      if (iVar6 == 0) {
        JavascriptError::ThrowRangeError(pSVar1,-0x7ff5ec37,(PCWSTR)0x0);
      }
    }
    bVar4 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
    if (bVar4) {
      obj = (ArrayBuffer *)JavascriptProxy::AutoProxyWrapper(obj);
    }
    if (bVar3) {
      constructor = VarTo<Js::RecyclableObject>(instance);
      obj = (ArrayBuffer *)
            JavascriptOperators::OrdinaryCreateFromConstructor
                      (constructor,(RecyclableObject *)obj,(DynamicObject *)0x0,pSVar1);
    }
    return obj;
  }
LAB_00b2eaff:
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ea00,L"ArrayBuffer");
}

Assistant:

Var ArrayBuffer::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

        if (!args.IsNewCall() || (newTarget && JavascriptOperators::IsUndefinedObject(newTarget)))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ClassConstructorCannotBeCalledWithoutNew, _u("ArrayBuffer"));
        }

        uint32 byteLength = 0;
        if (args.Info.Count > 1)
        {
            byteLength = ToIndex(args[1], JSERR_ArrayLengthConstructIncorrect, scriptContext, MaxArrayBufferLength);
        }

        RecyclableObject* newArr = scriptContext->GetLibrary()->CreateArrayBuffer(byteLength);
        Assert(VarIs<ArrayBuffer>(newArr));
        if (byteLength > 0 && !VarTo<ArrayBuffer>(newArr)->GetByteLength())
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_FunctionArgument_Invalid);
        }
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            newArr = Js::JavascriptProxy::AutoProxyWrapper(newArr);
        }
#endif
        return isCtorSuperCall ?
            JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), newArr, nullptr, scriptContext) :
            newArr;
    }